

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::emit_subgroup_op(CompilerMSL *this,Instruction *i)

{
  ushort uVar1;
  BaseType BVar2;
  Platform PVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t *puVar7;
  CompilerError *this_00;
  uint32_t op1;
  BaseType input_type;
  char *pcVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  uint32_t local_54;
  string local_50;
  
  puVar7 = Compiler::stream((Compiler *)this,i);
  uVar1 = i->op;
  if ((this->msl_options).emulate_subgroups == true) {
    if (uVar1 == 0x14d) {
      uVar4 = *puVar7;
      uVar6 = puVar7[1];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"true","");
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar4,uVar6,&local_50,true,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        return;
      }
      operator_delete(local_50._M_dataplus._M_p);
      return;
    }
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,"Subgroup emulation does not support operations other than Elect.");
    goto LAB_002b5713;
  }
  if ((this->msl_options).msl_version < 20000) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Subgroups are only supported in Metal 2.0 and up.");
    goto LAB_002b5713;
  }
  uVar4 = CompilerGLSL::get_integer_width_for_instruction(&this->super_CompilerGLSL,i);
  uVar10 = uVar4 - 8 >> 3;
  uVar5 = uVar4 << 0x1d | uVar10;
  if ((7 < uVar5) || ((0x8bU >> (uVar10 & 0x1f) & 1) == 0)) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Invalid bit width.");
    goto LAB_002b5713;
  }
  input_type = *(BaseType *)(&DAT_003e9c7c + (ulong)uVar5 * 4);
  BVar2 = *(BaseType *)(&DAT_003e9c9c + (ulong)uVar5 * 4);
  PVar3 = (this->msl_options).platform;
  if (PVar3 == macOS) {
    if (((((this->msl_options).msl_version < 0x4e84) && (3 < uVar1 - 0x159)) && (uVar1 != 0x151)) &&
       (uVar1 != 0x1150)) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,
                 "Subgroup ops beyond broadcast and shuffle on macOS require Metal 2.1 and up.");
      goto LAB_002b5713;
    }
    goto switchD_002b4bb8_caseD_151;
  }
  if ((PVar3 != iOS) ||
     ((uVar10 = (this->msl_options).msl_version, 0x4f4b < uVar10 &&
      ((this->msl_options).ios_use_simdgroup_functions != false)))) goto switchD_002b4bb8_caseD_151;
  if (0x1144 < uVar1) {
    if ((uVar1 - 0x114c < 3) || (uVar1 == 0x1145)) goto switchD_002b4bb8_caseD_14e;
    if (uVar1 != 0x1150) goto switchD_002b4bb8_caseD_15d;
    goto switchD_002b4bb8_caseD_151;
  }
  switch(uVar1) {
  case 0x14d:
    if (uVar10 < 0x4ee8) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Elect on iOS requires Metal 2.2 and up.");
      goto LAB_002b5713;
    }
    break;
  case 0x14e:
  case 0x14f:
  case 0x150:
  case 0x153:
  case 0x154:
  case 0x155:
  case 0x156:
  case 0x157:
  case 0x158:
switchD_002b4bb8_caseD_14e:
    if (uVar10 < 0x4ee8) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Ballot ops on iOS requires Metal 2.2 and up.");
      goto LAB_002b5713;
    }
  case 0x151:
  case 0x159:
  case 0x15a:
  case 0x15b:
  case 0x15c:
  case 0x16d:
  case 0x16e:
switchD_002b4bb8_caseD_151:
    uVar4 = *puVar7;
    local_54 = puVar7[1];
    if ((0xb < uVar1 - 0x1145) || (lVar11 = 2, (0xb83U >> (uVar1 - 0x1145 & 0x1f) & 1) == 0))
    goto LAB_002b55c6;
    goto LAB_002b4ca7;
  case 0x152:
    if (uVar10 < 0x4ee8) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"BroadcastFirst on iOS requires Metal 2.2 and up.");
      goto LAB_002b5713;
    }
    break;
  default:
switchD_002b4bb8_caseD_15d:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,
               "Subgroup ops beyond broadcast, ballot, and shuffle on iOS require Metal 2.3 and up."
              );
    goto LAB_002b5713;
  }
  uVar4 = *puVar7;
  local_54 = puVar7[1];
LAB_002b55c6:
  uVar6 = Compiler::evaluate_constant_u32((Compiler *)this,puVar7[2]);
  lVar11 = 3;
  if (uVar6 != 3) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Only subgroup scope is supported.");
    goto LAB_002b5713;
  }
LAB_002b4ca7:
  iVar9 = (int)lVar11;
  switch(uVar1) {
  case 0x14d:
    if (((this->msl_options).platform == iOS) &&
       (((this->msl_options).ios_use_simdgroup_functions & 1U) == 0)) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"quad_is_first()","");
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar4,local_54,&local_50,false,false);
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"simd_is_first()","");
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar4,local_54,&local_50,false,false);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    goto LAB_002b56a2;
  case 0x14e:
    goto switchD_002b4cc0_caseD_14e;
  case 0x14f:
switchD_002b4cc0_caseD_14f:
    uVar6 = puVar7[lVar11];
    if (((this->msl_options).platform == iOS) &&
       (((this->msl_options).ios_use_simdgroup_functions & 1U) == 0)) {
      pcVar8 = "quad_any";
    }
    else {
      pcVar8 = "simd_any";
    }
    goto LAB_002b5697;
  case 0x150:
switchD_002b4cc0_caseD_150:
    uVar6 = puVar7[lVar11];
    pcVar8 = "spvSubgroupAllEqual";
    goto LAB_002b5697;
  case 0x151:
switchD_002b4cc0_caseD_151:
    uVar6 = puVar7[lVar11];
    op1 = puVar7[lVar11 + 1];
    pcVar8 = "spvSubgroupBroadcast";
    break;
  case 0x152:
switchD_002b4cc0_caseD_152:
    uVar6 = puVar7[lVar11];
    pcVar8 = "spvSubgroupBroadcastFirst";
    goto LAB_002b5697;
  case 0x153:
switchD_002b4cc0_caseD_153:
    uVar6 = puVar7[lVar11];
    pcVar8 = "spvSubgroupBallot";
    goto LAB_002b5697;
  case 0x154:
    uVar6 = puVar7[lVar11];
    op1 = this->builtin_subgroup_invocation_id_id;
    goto LAB_002b5192;
  case 0x155:
    uVar6 = puVar7[lVar11];
    op1 = puVar7[lVar11 + 1];
LAB_002b5192:
    pcVar8 = "spvSubgroupBallotBitExtract";
    break;
  case 0x156:
    uVar10 = iVar9 + 1;
    uVar6 = puVar7[lVar11];
    if (uVar6 == 2) {
      uVar6 = puVar7[uVar10];
      op1 = this->builtin_subgroup_invocation_id_id;
      pcVar8 = "spvSubgroupBallotExclusiveBitCount";
    }
    else if (uVar6 == 1) {
      uVar6 = puVar7[uVar10];
      op1 = this->builtin_subgroup_invocation_id_id;
      pcVar8 = "spvSubgroupBallotInclusiveBitCount";
    }
    else {
      if (uVar6 != 0) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid BitCount operation.");
        goto LAB_002b5713;
      }
      uVar6 = puVar7[uVar10];
      op1 = this->builtin_subgroup_size_id;
      pcVar8 = "spvSubgroupBallotBitCount";
    }
    break;
  case 0x157:
    uVar6 = puVar7[lVar11];
    op1 = this->builtin_subgroup_size_id;
    pcVar8 = "spvSubgroupBallotFindLSB";
    break;
  case 0x158:
    uVar6 = puVar7[lVar11];
    op1 = this->builtin_subgroup_size_id;
    pcVar8 = "spvSubgroupBallotFindMSB";
    break;
  case 0x159:
    uVar6 = puVar7[lVar11];
    op1 = puVar7[lVar11 + 1];
    pcVar8 = "spvSubgroupShuffle";
    break;
  case 0x15a:
    uVar6 = puVar7[lVar11];
    op1 = puVar7[lVar11 + 1];
    pcVar8 = "spvSubgroupShuffleXor";
    break;
  case 0x15b:
    uVar6 = puVar7[lVar11];
    op1 = puVar7[lVar11 + 1];
    pcVar8 = "spvSubgroupShuffleUp";
    break;
  case 0x15c:
    uVar6 = puVar7[lVar11];
    op1 = puVar7[lVar11 + 1];
    pcVar8 = "spvSubgroupShuffleDown";
    break;
  case 0x15d:
    switch(puVar7[lVar11]) {
    case 0:
switchD_002b5069_caseD_0:
      uVar6 = puVar7[iVar9 + 1];
      pcVar8 = "simd_sum";
      break;
    case 1:
switchD_002b5069_caseD_1:
      uVar6 = puVar7[iVar9 + 1];
      pcVar8 = "simd_prefix_inclusive_sum";
      break;
    case 2:
switchD_002b5069_caseD_2:
      uVar6 = puVar7[iVar9 + 1];
      pcVar8 = "simd_prefix_exclusive_sum";
      break;
    case 3:
      uVar6 = Compiler::evaluate_constant_u32((Compiler *)this,puVar7[lVar11 + 2]);
      if (uVar6 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_002b5713;
      }
LAB_002b565c:
      uVar6 = puVar7[iVar9 + 1];
      pcVar8 = "quad_sum";
      break;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002b5713;
    }
    goto LAB_002b5697;
  case 0x15e:
    switch(puVar7[lVar11]) {
    case 0:
      goto switchD_002b5069_caseD_0;
    case 1:
      goto switchD_002b5069_caseD_1;
    case 2:
      goto switchD_002b5069_caseD_2;
    case 3:
      uVar6 = Compiler::evaluate_constant_u32((Compiler *)this,puVar7[lVar11 + 2]);
      if (uVar6 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_002b5713;
      }
      goto LAB_002b565c;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002b5713;
    }
  case 0x15f:
    switch(puVar7[lVar11]) {
    case 0:
switchD_002b5246_caseD_0:
      uVar6 = puVar7[iVar9 + 1];
      pcVar8 = "simd_product";
      break;
    case 1:
switchD_002b5246_caseD_1:
      uVar6 = puVar7[iVar9 + 1];
      pcVar8 = "simd_prefix_inclusive_product";
      break;
    case 2:
switchD_002b5246_caseD_2:
      uVar6 = puVar7[iVar9 + 1];
      pcVar8 = "simd_prefix_exclusive_product";
      break;
    case 3:
      uVar6 = Compiler::evaluate_constant_u32((Compiler *)this,puVar7[lVar11 + 2]);
      if (uVar6 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_002b5713;
      }
LAB_002b5684:
      uVar6 = puVar7[iVar9 + 1];
      pcVar8 = "quad_product";
      break;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002b5713;
    }
    goto LAB_002b5697;
  case 0x160:
    switch(puVar7[lVar11]) {
    case 0:
      goto switchD_002b5246_caseD_0;
    case 1:
      goto switchD_002b5246_caseD_1;
    case 2:
      goto switchD_002b5246_caseD_2;
    case 3:
      uVar6 = Compiler::evaluate_constant_u32((Compiler *)this,puVar7[lVar11 + 2]);
      if (uVar6 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_002b5713;
      }
      goto LAB_002b5684;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002b5713;
    }
  case 0x161:
    if (3 < puVar7[lVar11]) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002b5713;
    }
    switch(puVar7[lVar11]) {
    case 0:
      uVar6 = puVar7[iVar9 + 1U];
      pcVar8 = "simd_min";
      break;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformSMin.");
      goto LAB_002b5713;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformSMin.");
LAB_002b5713:
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 3:
      uVar6 = Compiler::evaluate_constant_u32((Compiler *)this,puVar7[lVar11 + 2]);
      if (uVar6 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_002b5713;
      }
      uVar6 = puVar7[iVar9 + 1U];
      pcVar8 = "quad_min";
    }
LAB_002b5550:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,uVar4,local_54,uVar6,pcVar8,input_type,input_type);
    goto LAB_002b56a2;
  case 0x162:
    if (3 < puVar7[lVar11]) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002b5713;
    }
    switch(puVar7[lVar11]) {
    case 0:
      uVar6 = puVar7[iVar9 + 1U];
      pcVar8 = "simd_min";
      input_type = BVar2;
      break;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformUMin.");
      goto LAB_002b5713;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformUMin.");
      goto LAB_002b5713;
    case 3:
      uVar6 = Compiler::evaluate_constant_u32((Compiler *)this,puVar7[lVar11 + 2]);
      if (uVar6 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_002b5713;
      }
      uVar6 = puVar7[iVar9 + 1U];
      pcVar8 = "quad_min";
      input_type = BVar2;
    }
    goto LAB_002b5550;
  case 0x163:
    if (3 < puVar7[lVar11]) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002b5713;
    }
    switch(puVar7[lVar11]) {
    case 0:
      uVar6 = puVar7[iVar9 + 1U];
      pcVar8 = "simd_min";
      break;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformFMin.");
      goto LAB_002b5713;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformFMin.");
      goto LAB_002b5713;
    case 3:
      uVar6 = Compiler::evaluate_constant_u32((Compiler *)this,puVar7[lVar11 + 2]);
      if (uVar6 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_002b5713;
      }
      uVar6 = puVar7[iVar9 + 1U];
      pcVar8 = "quad_min";
    }
    goto LAB_002b5697;
  case 0x164:
    if (3 < puVar7[lVar11]) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002b5713;
    }
    switch(puVar7[lVar11]) {
    case 0:
      uVar6 = puVar7[iVar9 + 1U];
      pcVar8 = "simd_max";
      break;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformSMax.");
      goto LAB_002b5713;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformSMax.");
      goto LAB_002b5713;
    case 3:
      uVar6 = Compiler::evaluate_constant_u32((Compiler *)this,puVar7[lVar11 + 2]);
      if (uVar6 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_002b5713;
      }
      uVar6 = puVar7[iVar9 + 1U];
      pcVar8 = "quad_max";
    }
    goto LAB_002b5550;
  case 0x165:
    if (3 < puVar7[lVar11]) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002b5713;
    }
    switch(puVar7[lVar11]) {
    case 0:
      uVar6 = puVar7[iVar9 + 1U];
      pcVar8 = "simd_max";
      input_type = BVar2;
      break;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformUMax.");
      goto LAB_002b5713;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformUMax.");
      goto LAB_002b5713;
    case 3:
      uVar6 = Compiler::evaluate_constant_u32((Compiler *)this,puVar7[lVar11 + 2]);
      if (uVar6 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_002b5713;
      }
      uVar6 = puVar7[iVar9 + 1U];
      pcVar8 = "quad_max";
      input_type = BVar2;
    }
    goto LAB_002b5550;
  case 0x166:
    if (3 < puVar7[lVar11]) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002b5713;
    }
    switch(puVar7[lVar11]) {
    case 0:
      uVar6 = puVar7[iVar9 + 1U];
      pcVar8 = "simd_max";
      break;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformFMax.");
      goto LAB_002b5713;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformFMax.");
      goto LAB_002b5713;
    case 3:
      uVar6 = Compiler::evaluate_constant_u32((Compiler *)this,puVar7[lVar11 + 2]);
      if (uVar6 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_002b5713;
      }
      uVar6 = puVar7[iVar9 + 1U];
      pcVar8 = "quad_max";
    }
    goto LAB_002b5697;
  case 0x167:
    switch(puVar7[lVar11]) {
    case 0:
switchD_002b52f2_caseD_0:
      uVar6 = puVar7[iVar9 + 1];
      pcVar8 = "simd_and";
      goto LAB_002b5697;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformBitwiseAnd.");
      break;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformBitwiseAnd.");
      break;
    case 3:
      uVar6 = Compiler::evaluate_constant_u32((Compiler *)this,puVar7[lVar11 + 2]);
      if (uVar6 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        break;
      }
LAB_002b559d:
      uVar6 = puVar7[iVar9 + 1];
      pcVar8 = "quad_and";
      goto LAB_002b5697;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_002b5713;
  case 0x168:
    switch(puVar7[lVar11]) {
    case 0:
switchD_002b51c0_caseD_0:
      uVar6 = puVar7[iVar9 + 1];
      pcVar8 = "simd_or";
      goto LAB_002b5697;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformBitwiseOr.");
      break;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformBitwiseOr.");
      break;
    case 3:
      uVar6 = Compiler::evaluate_constant_u32((Compiler *)this,puVar7[lVar11 + 2]);
      if (uVar6 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        break;
      }
LAB_002b54da:
      uVar6 = puVar7[iVar9 + 1];
      pcVar8 = "quad_or";
      goto LAB_002b5697;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_002b5713;
  case 0x169:
    switch(puVar7[lVar11]) {
    case 0:
switchD_002b500c_caseD_0:
      uVar6 = puVar7[iVar9 + 1];
      pcVar8 = "simd_xor";
      goto LAB_002b5697;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformBitwiseXor.");
      break;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformBitwiseXor.");
      break;
    case 3:
      uVar6 = Compiler::evaluate_constant_u32((Compiler *)this,puVar7[lVar11 + 2]);
      if (uVar6 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        break;
      }
LAB_002b5572:
      uVar6 = puVar7[iVar9 + 1];
      pcVar8 = "quad_xor";
      goto LAB_002b5697;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_002b5713;
  case 0x16a:
    switch(puVar7[lVar11]) {
    case 0:
      goto switchD_002b52f2_caseD_0;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformLogicalAnd.");
      break;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformLogicalAnd.");
      break;
    case 3:
      uVar6 = Compiler::evaluate_constant_u32((Compiler *)this,puVar7[lVar11 + 2]);
      if (uVar6 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        break;
      }
      goto LAB_002b559d;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_002b5713;
  case 0x16b:
    switch(puVar7[lVar11]) {
    case 0:
      goto switchD_002b51c0_caseD_0;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformLogicalOr.");
      break;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformLogicalOr.");
      break;
    case 3:
      uVar6 = Compiler::evaluate_constant_u32((Compiler *)this,puVar7[lVar11 + 2]);
      if (uVar6 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        break;
      }
      goto LAB_002b54da;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_002b5713;
  case 0x16c:
    switch(puVar7[lVar11]) {
    case 0:
      goto switchD_002b500c_caseD_0;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformLogicalXor.");
      break;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformLogicalXor.");
      break;
    case 3:
      uVar6 = Compiler::evaluate_constant_u32((Compiler *)this,puVar7[lVar11 + 2]);
      if (uVar6 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        break;
      }
      goto LAB_002b5572;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_002b5713;
  case 0x16d:
    uVar6 = puVar7[lVar11];
    op1 = puVar7[lVar11 + 1];
    pcVar8 = "spvQuadBroadcast";
    break;
  case 0x16e:
    uVar6 = puVar7[lVar11];
    op1 = puVar7[lVar11 + 1];
    pcVar8 = "spvQuadSwap";
    break;
  default:
    switch(uVar1) {
    case 0x1145:
      goto switchD_002b4cc0_caseD_153;
    case 0x1146:
      goto switchD_002b4cc0_caseD_152;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid opcode for subgroup.");
      goto LAB_002b5713;
    case 0x114c:
      goto switchD_002b4cc0_caseD_14e;
    case 0x114d:
      goto switchD_002b4cc0_caseD_14f;
    case 0x114e:
      goto switchD_002b4cc0_caseD_150;
    case 0x1150:
      goto switchD_002b4cc0_caseD_151;
    }
  }
  CompilerGLSL::emit_binary_func_op(&this->super_CompilerGLSL,uVar4,local_54,uVar6,op1,pcVar8);
LAB_002b56a2:
  CompilerGLSL::register_control_dependent_expression(&this->super_CompilerGLSL,local_54);
  return;
switchD_002b4cc0_caseD_14e:
  uVar6 = puVar7[lVar11];
  if (((this->msl_options).platform == iOS) &&
     (((this->msl_options).ios_use_simdgroup_functions & 1U) == 0)) {
    pcVar8 = "quad_all";
  }
  else {
    pcVar8 = "simd_all";
  }
LAB_002b5697:
  CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,uVar4,local_54,uVar6,pcVar8);
  goto LAB_002b56a2;
}

Assistant:

void CompilerMSL::emit_subgroup_op(const Instruction &i)
{
	const uint32_t *ops = stream(i);
	auto op = static_cast<Op>(i.op);

	if (msl_options.emulate_subgroups)
	{
		// In this mode, only the GroupNonUniform cap is supported. The only op
		// we need to handle, then, is OpGroupNonUniformElect.
		if (op != OpGroupNonUniformElect)
			SPIRV_CROSS_THROW("Subgroup emulation does not support operations other than Elect.");
		// In this mode, the subgroup size is assumed to be one, so every invocation
		// is elected.
		emit_op(ops[0], ops[1], "true", true);
		return;
	}

	// Metal 2.0 is required. iOS only supports quad ops on 11.0 (2.0), with
	// full support in 13.0 (2.2). macOS only supports broadcast and shuffle on
	// 10.13 (2.0), with full support in 10.14 (2.1).
	// Note that Apple GPUs before A13 make no distinction between a quad-group
	// and a SIMD-group; all SIMD-groups are quad-groups on those.
	if (!msl_options.supports_msl_version(2))
		SPIRV_CROSS_THROW("Subgroups are only supported in Metal 2.0 and up.");

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_instruction(i);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	if (msl_options.is_ios() && (!msl_options.supports_msl_version(2, 3) || !msl_options.ios_use_simdgroup_functions))
	{
		switch (op)
		{
		default:
			SPIRV_CROSS_THROW("Subgroup ops beyond broadcast, ballot, and shuffle on iOS require Metal 2.3 and up.");
		case OpGroupNonUniformBroadcastFirst:
			if (!msl_options.supports_msl_version(2, 2))
				SPIRV_CROSS_THROW("BroadcastFirst on iOS requires Metal 2.2 and up.");
			break;
		case OpGroupNonUniformElect:
			if (!msl_options.supports_msl_version(2, 2))
				SPIRV_CROSS_THROW("Elect on iOS requires Metal 2.2 and up.");
			break;
		case OpGroupNonUniformAny:
		case OpGroupNonUniformAll:
		case OpGroupNonUniformAllEqual:
		case OpGroupNonUniformBallot:
		case OpGroupNonUniformInverseBallot:
		case OpGroupNonUniformBallotBitExtract:
		case OpGroupNonUniformBallotFindLSB:
		case OpGroupNonUniformBallotFindMSB:
		case OpGroupNonUniformBallotBitCount:
		case OpSubgroupBallotKHR:
		case OpSubgroupAllKHR:
		case OpSubgroupAnyKHR:
		case OpSubgroupAllEqualKHR:
			if (!msl_options.supports_msl_version(2, 2))
				SPIRV_CROSS_THROW("Ballot ops on iOS requires Metal 2.2 and up.");
			break;
		case OpGroupNonUniformBroadcast:
		case OpGroupNonUniformShuffle:
		case OpGroupNonUniformShuffleXor:
		case OpGroupNonUniformShuffleUp:
		case OpGroupNonUniformShuffleDown:
		case OpGroupNonUniformQuadSwap:
		case OpGroupNonUniformQuadBroadcast:
		case OpSubgroupReadInvocationKHR:
			break;
		}
	}

	if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 1))
	{
		switch (op)
		{
		default:
			SPIRV_CROSS_THROW("Subgroup ops beyond broadcast and shuffle on macOS require Metal 2.1 and up.");
		case OpGroupNonUniformBroadcast:
		case OpGroupNonUniformShuffle:
		case OpGroupNonUniformShuffleXor:
		case OpGroupNonUniformShuffleUp:
		case OpGroupNonUniformShuffleDown:
		case OpSubgroupReadInvocationKHR:
			break;
		}
	}

	uint32_t op_idx = 0;
	uint32_t result_type = ops[op_idx++];
	uint32_t id = ops[op_idx++];

	Scope scope;
	switch (op)
	{
	case OpSubgroupBallotKHR:
	case OpSubgroupFirstInvocationKHR:
	case OpSubgroupReadInvocationKHR:
	case OpSubgroupAllKHR:
	case OpSubgroupAnyKHR:
	case OpSubgroupAllEqualKHR:
		// These earlier instructions don't have the scope operand.
		scope = ScopeSubgroup;
		break;
	default:
		scope = static_cast<Scope>(evaluate_constant_u32(ops[op_idx++]));
		break;
	}
	if (scope != ScopeSubgroup)
		SPIRV_CROSS_THROW("Only subgroup scope is supported.");

	switch (op)
	{
	case OpGroupNonUniformElect:
		if (msl_options.use_quadgroup_operation())
			emit_op(result_type, id, "quad_is_first()", false);
		else
			emit_op(result_type, id, "simd_is_first()", false);
		break;

	case OpGroupNonUniformBroadcast:
	case OpSubgroupReadInvocationKHR:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupBroadcast");
		break;

	case OpGroupNonUniformBroadcastFirst:
	case OpSubgroupFirstInvocationKHR:
		emit_unary_func_op(result_type, id, ops[op_idx], "spvSubgroupBroadcastFirst");
		break;

	case OpGroupNonUniformBallot:
	case OpSubgroupBallotKHR:
		emit_unary_func_op(result_type, id, ops[op_idx], "spvSubgroupBallot");
		break;

	case OpGroupNonUniformInverseBallot:
		emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_invocation_id_id, "spvSubgroupBallotBitExtract");
		break;

	case OpGroupNonUniformBallotBitExtract:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupBallotBitExtract");
		break;

	case OpGroupNonUniformBallotFindLSB:
		emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_size_id, "spvSubgroupBallotFindLSB");
		break;

	case OpGroupNonUniformBallotFindMSB:
		emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_size_id, "spvSubgroupBallotFindMSB");
		break;

	case OpGroupNonUniformBallotBitCount:
	{
		auto operation = static_cast<GroupOperation>(ops[op_idx++]);
		switch (operation)
		{
		case GroupOperationReduce:
			emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_size_id, "spvSubgroupBallotBitCount");
			break;
		case GroupOperationInclusiveScan:
			emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_invocation_id_id,
			                    "spvSubgroupBallotInclusiveBitCount");
			break;
		case GroupOperationExclusiveScan:
			emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_invocation_id_id,
			                    "spvSubgroupBallotExclusiveBitCount");
			break;
		default:
			SPIRV_CROSS_THROW("Invalid BitCount operation.");
		}
		break;
	}

	case OpGroupNonUniformShuffle:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupShuffle");
		break;

	case OpGroupNonUniformShuffleXor:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupShuffleXor");
		break;

	case OpGroupNonUniformShuffleUp:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupShuffleUp");
		break;

	case OpGroupNonUniformShuffleDown:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupShuffleDown");
		break;

	case OpGroupNonUniformAll:
	case OpSubgroupAllKHR:
		if (msl_options.use_quadgroup_operation())
			emit_unary_func_op(result_type, id, ops[op_idx], "quad_all");
		else
			emit_unary_func_op(result_type, id, ops[op_idx], "simd_all");
		break;

	case OpGroupNonUniformAny:
	case OpSubgroupAnyKHR:
		if (msl_options.use_quadgroup_operation())
			emit_unary_func_op(result_type, id, ops[op_idx], "quad_any");
		else
			emit_unary_func_op(result_type, id, ops[op_idx], "simd_any");
		break;

	case OpGroupNonUniformAllEqual:
	case OpSubgroupAllEqualKHR:
		emit_unary_func_op(result_type, id, ops[op_idx], "spvSubgroupAllEqual");
		break;

		// clang-format off
#define MSL_GROUP_OP(op, msl_op) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[op_idx++]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op(result_type, id, ops[op_idx], "simd_" #msl_op); \
		else if (operation == GroupOperationInclusiveScan) \
			emit_unary_func_op(result_type, id, ops[op_idx], "simd_prefix_inclusive_" #msl_op); \
		else if (operation == GroupOperationExclusiveScan) \
			emit_unary_func_op(result_type, id, ops[op_idx], "simd_prefix_exclusive_" #msl_op); \
		else if (operation == GroupOperationClusteredReduce) \
		{ \
			/* Only cluster sizes of 4 are supported. */ \
			uint32_t cluster_size = evaluate_constant_u32(ops[op_idx + 1]); \
			if (cluster_size != 4) \
				SPIRV_CROSS_THROW("Metal only supports quad ClusteredReduce."); \
			emit_unary_func_op(result_type, id, ops[op_idx], "quad_" #msl_op); \
		} \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}